

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

void LzmaEnc_Construct(CLzmaEnc *p)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  Byte *__s;
  size_t __n;
  bool bVar7;
  CLzmaEncProps props;
  CLzmaEncProps local_58;
  
  (p->rc).bufBase = (Byte *)0x0;
  (p->rc).outStream = (ISeqOutStream *)0x0;
  MatchFinder_Construct(&p->matchFinderBase);
  local_58.level = 5;
  local_58.dictSize = 0;
  local_58.reduceSize._0_4_ = 0xffffffff;
  local_58.reduceSize._4_4_ = 0xffffffff;
  local_58.lc = -1;
  local_58.lp = -1;
  local_58.pb = -1;
  local_58.algo = -1;
  local_58.fb = -1;
  local_58.btMode = -1;
  local_58.numHashBytes = -1;
  local_58.mc = 0;
  local_58.writeEndMark = 0;
  local_58.numThreads = -1;
  LzmaEnc_SetProps(p,&local_58);
  p->g_FastPos[0] = '\0';
  p->g_FastPos[1] = '\x01';
  __s = p->g_FastPos + 2;
  uVar4 = 2;
  do {
    __n = 1L << ((char)(uVar4 >> 1) - 1U & 0x3f);
    memset(__s,uVar4,__n);
    __s = __s + __n;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x1a);
  uVar1 = 8;
  do {
    iVar3 = 0;
    iVar2 = 0;
    uVar5 = uVar1 & 0xffffffff;
    do {
      uVar4 = (int)uVar5 * (int)uVar5;
      iVar2 = iVar2 * 2;
      uVar6 = uVar4;
      if (0xffff < uVar4) {
        do {
          uVar6 = uVar4 >> 1;
          iVar2 = iVar2 + 1;
          bVar7 = 0x1ffff < uVar4;
          uVar4 = uVar6;
        } while (bVar7);
      }
      iVar3 = iVar3 + 1;
      uVar5 = (ulong)uVar6;
    } while (iVar3 != 4);
    p->ProbPrices[uVar1 >> 4] = 0xa1 - iVar2;
    bVar7 = uVar1 < 0x7f0;
    uVar1 = uVar1 + 0x10;
  } while (bVar7);
  p->litProbs = (UInt16 *)0x0;
  (p->saveState).litProbs = (UInt16 *)0x0;
  return;
}

Assistant:

void LzmaEnc_Construct(CLzmaEnc *p)
{
  RangeEnc_Construct(&p->rc);
  MatchFinder_Construct(&p->matchFinderBase);
  
  #ifndef _7ZIP_ST
  MatchFinderMt_Construct(&p->matchFinderMt);
  p->matchFinderMt.MatchFinder = &p->matchFinderBase;
  #endif

  {
    CLzmaEncProps props;
    LzmaEncProps_Init(&props);
    LzmaEnc_SetProps(p, &props);
  }

  #ifndef LZMA_LOG_BSR
  LzmaEnc_FastPosInit(p->g_FastPos);
  #endif

  LzmaEnc_InitPriceTables(p->ProbPrices);
  p->litProbs = NULL;
  p->saveState.litProbs = NULL;
}